

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionaryMLT<true,_true>::search_key(DictionaryMLT<false,_false> *this,char *key)

{
  bool bVar1;
  uint32_t uVar2;
  char *in_RSI;
  long in_RDI;
  Query query;
  Query *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  DaTrie<true,_true,_false> *in_stack_ffffffffffffffc8;
  Query local_30;
  uint32_t local_4;
  
  this_00 = &local_30;
  Query::Query(this_00,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>::
  operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
              *)0x18e2fa);
  bVar1 = DaTrie<true,_true,_true>::search_prefix
                    ((DaTrie<true,_true,_true> *)
                     CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),this_00);
  if (bVar1) {
    bVar1 = Query::is_finished(&local_30);
    if (bVar1) {
      local_4 = Query::value(&local_30);
    }
    else {
      Query::set_node_pos(&local_30,0);
      uVar2 = Query::value(&local_30);
      std::
      vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                    *)(in_RDI + 0x10),(ulong)uVar2);
      std::
      unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                    *)0x18e3b3);
      bVar1 = DaTrie<true,_true,_false>::search_key
                        (in_stack_ffffffffffffffc8,
                         (Query *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (bVar1) {
        local_4 = Query::value(&local_30);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query(&local_30);
  return local_4;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      return query.value();
    }

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[query.value()]->search_key(query)) {
      return NOT_FOUND;
    }
    return query.value();
  }